

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::Parser(Parser *this)

{
  Scanner *pSVar1;
  
  (this->curr).s._M_dataplus._M_p = (pointer)&(this->curr).s.field_2;
  (this->curr).s._M_string_length = 0;
  (this->curr).s.field_2._M_local_buf[0] = '\0';
  (this->predList).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predList).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predList).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->it)._M_current = (tok *)0x0;
  pSVar1 = (Scanner *)operator_new(0x48);
  *(undefined8 *)pSVar1 = 0;
  (pSVar1->tstr)._M_dataplus._M_p = (pointer)0x0;
  (pSVar1->tstr)._M_string_length = 0;
  (pSVar1->tstr).field_2._M_allocated_capacity = 0;
  (pSVar1->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pSVar1->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((long)&(pSVar1->tstr).field_2 + 8) = 0;
  (pSVar1->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pSVar1->lines = 0;
  pSVar1->last_qoute_line = 0;
  (pSVar1->tstr)._M_dataplus._M_p = (pointer)&(pSVar1->tstr).field_2;
  (pSVar1->tstr)._M_string_length = 0;
  (pSVar1->tstr).field_2._M_local_buf[0] = '\0';
  (pSVar1->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pSVar1->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pSVar1->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->s = pSVar1;
  return;
}

Assistant:

Parser::Parser()
{
	s = new Scanner();
}